

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Admin.h
# Opt level: O0

void __thiscall Admin::resizeRooms(Admin *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  Room *pRVar4;
  Room *local_48;
  int local_28;
  int i;
  Room *resizesRoomList;
  Admin *this_local;
  
  uVar2 = (ulong)(Innopolis->rooms_count << 1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x28),0);
  if (SUB168(auVar1 * ZEXT816(0x28),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pRVar4 = (Room *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_48 = pRVar4;
    do {
      Room::Room(local_48);
      local_48 = local_48 + 1;
    } while (local_48 != pRVar4 + uVar2);
  }
  for (local_28 = 0; local_28 < Innopolis->rooms_count; local_28 = local_28 + 1) {
    memcpy(pRVar4 + local_28,Innopolis->rooms + local_28,0x24);
  }
  Innopolis->rooms_count = Innopolis->rooms_count << 1;
  Innopolis->rooms = pRVar4;
  return;
}

Assistant:

void resizeRooms(){
        Room* resizesRoomList = new Room[Innopolis->rooms_count*2];
        for(int i=0;i<Innopolis->rooms_count;i++){
            resizesRoomList[i] = Innopolis->rooms[i];
        }
        Innopolis->rooms_count<<=1;
        Innopolis->rooms = resizesRoomList;
    }